

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpOutputStream::queueWrite(HttpOutputStream *this,String *content)

{
  String *pSVar1;
  HttpOutputStream *local_40;
  String local_38;
  Promise<void> local_20;
  String *local_18;
  String *content_local;
  HttpOutputStream *this_local;
  
  local_40 = this;
  local_18 = content;
  content_local = (String *)this;
  pSVar1 = mv<kj::String>(content);
  String::String(&local_38,pSVar1);
  Promise<void>::
  then<kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::_lambda()_1_>
            (&local_20,(Type *)&this->writeQueue);
  Promise<void>::operator=(&this->writeQueue,&local_20);
  Promise<void>::~Promise(&local_20);
  kj::(anonymous_namespace)::HttpOutputStream::queueWrite(kj::String)::{lambda()#1}::~String
            ((_lambda___1_ *)&local_40);
  return;
}

Assistant:

void queueWrite(kj::String content) {
    // We only use queueWrite() in cases where we can take ownership of the write buffer, and where
    // it is convenient if we can return `void` rather than a promise.  In particular, this is used
    // to write headers and chunk boundaries. Writes of application data do not go into
    // `writeQueue` because this would prevent cancellation. Instead, they wait until `writeQueue`
    // is empty, then they make the write directly, using `writeInProgress` to detect and block
    // concurrent writes.

    writeQueue = writeQueue.then([this,content=kj::mv(content)]() mutable {
      auto promise = inner.write(content.asBytes());
      return promise.attach(kj::mv(content));
    });
  }